

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DHMap.hpp
# Opt level: O0

void __thiscall
Lib::
DHMap<Kernel::Unit_*,_std::unique_ptr<Lib::InferenceExtra,_std::default_delete<Lib::InferenceExtra>_>,_Lib::DefaultHash,_Lib::DefaultHash2>
::expand(DHMap<Kernel::Unit_*,_std::unique_ptr<Lib::InferenceExtra,_std::default_delete<Lib::InferenceExtra>_>,_Lib::DefaultHash,_Lib::DefaultHash2>
         *this)

{
  undefined4 uVar1;
  DHMap<Kernel::Unit_*,_std::unique_ptr<Lib::InferenceExtra,_std::default_delete<Lib::InferenceExtra>_>,_Lib::DefaultHash,_Lib::DefaultHash2>
  *__ptr;
  undefined8 uVar2;
  Entry *pEVar3;
  unique_ptr<Lib::InferenceExtra,_std::default_delete<Lib::InferenceExtra>_> *in_RDI;
  Entry *ep;
  int oldCapacity;
  uint oldTimestamp;
  Entry *oldAfterLast;
  Entry *oldEntries;
  void *mem;
  int newCapacity;
  size_t in_stack_ffffffffffffffa0;
  unique_ptr<Lib::InferenceExtra,_std::default_delete<Lib::InferenceExtra>_> *this_00;
  size_t in_stack_ffffffffffffffa8;
  _Head_base<0UL,_Lib::InferenceExtra_*,_false> in_stack_ffffffffffffffb8;
  DHMap<Kernel::Unit_*,_std::unique_ptr<Lib::InferenceExtra,_std::default_delete<Lib::InferenceExtra>_>,_Lib::DefaultHash,_Lib::DefaultHash2>
  *this_01;
  undefined4 in_stack_ffffffffffffffc8;
  int iVar4;
  undefined4 in_stack_ffffffffffffffcc;
  uint uVar5;
  Exception *in_stack_ffffffffffffffd0;
  DHMap<Kernel::Unit_*,_std::unique_ptr<Lib::InferenceExtra,_std::default_delete<Lib::InferenceExtra>_>,_Lib::DefaultHash,_Lib::DefaultHash2>
  *pDVar6;
  
  if (0x1c < *(int *)((long)&in_RDI[1]._M_t.
                             super___uniq_ptr_impl<Lib::InferenceExtra,_std::default_delete<Lib::InferenceExtra>_>
                             ._M_t.
                             super__Tuple_impl<0UL,_Lib::InferenceExtra_*,_std::default_delete<Lib::InferenceExtra>_>
                             .super__Head_base<0UL,_Lib::InferenceExtra_*,_false>._M_head_impl + 4))
  {
    uVar2 = __cxa_allocate_exception(0x28);
    Lib::Exception::Exception
              (in_stack_ffffffffffffffd0,
               (char *)CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8));
    __cxa_throw(uVar2,&Lib::Exception::typeinfo,Lib::Exception::~Exception);
  }
  uVar1 = *(undefined4 *)
           (DHMapTableCapacities +
           (long)(*(int *)((long)&in_RDI[1]._M_t.
                                  super___uniq_ptr_impl<Lib::InferenceExtra,_std::default_delete<Lib::InferenceExtra>_>
                                  ._M_t.
                                  super__Tuple_impl<0UL,_Lib::InferenceExtra_*,_std::default_delete<Lib::InferenceExtra>_>
                                  .super__Head_base<0UL,_Lib::InferenceExtra_*,_false>._M_head_impl
                          + 4) + 1) * 4);
  Lib::alloc(in_stack_ffffffffffffffa0);
  __ptr = (DHMap<Kernel::Unit_*,_std::unique_ptr<Lib::InferenceExtra,_std::default_delete<Lib::InferenceExtra>_>,_Lib::DefaultHash,_Lib::DefaultHash2>
           *)in_RDI[3]._M_t.
             super___uniq_ptr_impl<Lib::InferenceExtra,_std::default_delete<Lib::InferenceExtra>_>.
             _M_t.
             super__Tuple_impl<0UL,_Lib::InferenceExtra_*,_std::default_delete<Lib::InferenceExtra>_>
             .super__Head_base<0UL,_Lib::InferenceExtra_*,_false>._M_head_impl;
  pDVar6 = (DHMap<Kernel::Unit_*,_std::unique_ptr<Lib::InferenceExtra,_std::default_delete<Lib::InferenceExtra>_>,_Lib::DefaultHash,_Lib::DefaultHash2>
            *)in_RDI[4]._M_t.
              super___uniq_ptr_impl<Lib::InferenceExtra,_std::default_delete<Lib::InferenceExtra>_>.
              _M_t.
              super__Tuple_impl<0UL,_Lib::InferenceExtra_*,_std::default_delete<Lib::InferenceExtra>_>
              .super__Head_base<0UL,_Lib::InferenceExtra_*,_false>._M_head_impl;
  uVar5 = *(uint *)&(in_RDI->_M_t).
                    super___uniq_ptr_impl<Lib::InferenceExtra,_std::default_delete<Lib::InferenceExtra>_>
                    ._M_t.
                    super__Tuple_impl<0UL,_Lib::InferenceExtra_*,_std::default_delete<Lib::InferenceExtra>_>
                    .super__Head_base<0UL,_Lib::InferenceExtra_*,_false>._M_head_impl;
  iVar4 = *(int *)&in_RDI[2]._M_t.
                   super___uniq_ptr_impl<Lib::InferenceExtra,_std::default_delete<Lib::InferenceExtra>_>
                   ._M_t.
                   super__Tuple_impl<0UL,_Lib::InferenceExtra_*,_std::default_delete<Lib::InferenceExtra>_>
                   .super__Head_base<0UL,_Lib::InferenceExtra_*,_false>._M_head_impl;
  *(undefined4 *)
   &(in_RDI->_M_t).
    super___uniq_ptr_impl<Lib::InferenceExtra,_std::default_delete<Lib::InferenceExtra>_>._M_t.
    super__Tuple_impl<0UL,_Lib::InferenceExtra_*,_std::default_delete<Lib::InferenceExtra>_>.
    super__Head_base<0UL,_Lib::InferenceExtra_*,_false>._M_head_impl = 1;
  *(undefined4 *)
   ((long)&(in_RDI->_M_t).
           super___uniq_ptr_impl<Lib::InferenceExtra,_std::default_delete<Lib::InferenceExtra>_>.
           _M_t.
           super__Tuple_impl<0UL,_Lib::InferenceExtra_*,_std::default_delete<Lib::InferenceExtra>_>.
           super__Head_base<0UL,_Lib::InferenceExtra_*,_false>._M_head_impl + 4) = 0;
  *(undefined4 *)
   &in_RDI[1]._M_t.
    super___uniq_ptr_impl<Lib::InferenceExtra,_std::default_delete<Lib::InferenceExtra>_>._M_t.
    super__Tuple_impl<0UL,_Lib::InferenceExtra_*,_std::default_delete<Lib::InferenceExtra>_>.
    super__Head_base<0UL,_Lib::InferenceExtra_*,_false>._M_head_impl = 0;
  *(int *)((long)&in_RDI[1]._M_t.
                  super___uniq_ptr_impl<Lib::InferenceExtra,_std::default_delete<Lib::InferenceExtra>_>
                  ._M_t.
                  super__Tuple_impl<0UL,_Lib::InferenceExtra_*,_std::default_delete<Lib::InferenceExtra>_>
                  .super__Head_base<0UL,_Lib::InferenceExtra_*,_false>._M_head_impl + 4) =
       *(int *)((long)&in_RDI[1]._M_t.
                       super___uniq_ptr_impl<Lib::InferenceExtra,_std::default_delete<Lib::InferenceExtra>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_Lib::InferenceExtra_*,_std::default_delete<Lib::InferenceExtra>_>
                       .super__Head_base<0UL,_Lib::InferenceExtra_*,_false>._M_head_impl + 4) + 1;
  *(undefined4 *)
   &in_RDI[2]._M_t.
    super___uniq_ptr_impl<Lib::InferenceExtra,_std::default_delete<Lib::InferenceExtra>_>._M_t.
    super__Tuple_impl<0UL,_Lib::InferenceExtra_*,_std::default_delete<Lib::InferenceExtra>_>.
    super__Head_base<0UL,_Lib::InferenceExtra_*,_false>._M_head_impl = uVar1;
  *(undefined4 *)
   ((long)&in_RDI[2]._M_t.
           super___uniq_ptr_impl<Lib::InferenceExtra,_std::default_delete<Lib::InferenceExtra>_>.
           _M_t.
           super__Tuple_impl<0UL,_Lib::InferenceExtra_*,_std::default_delete<Lib::InferenceExtra>_>.
           super__Head_base<0UL,_Lib::InferenceExtra_*,_false>._M_head_impl + 4) =
       *(undefined4 *)
        (DHMapTableNextExpansions +
        (long)*(int *)((long)&in_RDI[1]._M_t.
                              super___uniq_ptr_impl<Lib::InferenceExtra,_std::default_delete<Lib::InferenceExtra>_>
                              ._M_t.
                              super__Tuple_impl<0UL,_Lib::InferenceExtra_*,_std::default_delete<Lib::InferenceExtra>_>
                              .super__Head_base<0UL,_Lib::InferenceExtra_*,_false>._M_head_impl + 4)
        * 4);
  pEVar3 = array_new<Lib::DHMap<Kernel::Unit*,std::unique_ptr<Lib::InferenceExtra,std::default_delete<Lib::InferenceExtra>>,Lib::DefaultHash,Lib::DefaultHash2>::Entry>
                     (in_RDI,in_stack_ffffffffffffffa8);
  in_RDI[3]._M_t.
  super___uniq_ptr_impl<Lib::InferenceExtra,_std::default_delete<Lib::InferenceExtra>_>._M_t.
  super__Tuple_impl<0UL,_Lib::InferenceExtra_*,_std::default_delete<Lib::InferenceExtra>_>.
  super__Head_base<0UL,_Lib::InferenceExtra_*,_false>._M_head_impl = (InferenceExtra *)pEVar3;
  in_RDI[4]._M_t.
  super___uniq_ptr_impl<Lib::InferenceExtra,_std::default_delete<Lib::InferenceExtra>_>._M_t.
  super__Tuple_impl<0UL,_Lib::InferenceExtra_*,_std::default_delete<Lib::InferenceExtra>_>.
  super__Head_base<0UL,_Lib::InferenceExtra_*,_false>._M_head_impl =
       in_RDI[3]._M_t.
       super___uniq_ptr_impl<Lib::InferenceExtra,_std::default_delete<Lib::InferenceExtra>_>._M_t.
       super__Tuple_impl<0UL,_Lib::InferenceExtra_*,_std::default_delete<Lib::InferenceExtra>_>.
       super__Head_base<0UL,_Lib::InferenceExtra_*,_false>._M_head_impl +
       (long)*(int *)&in_RDI[2]._M_t.
                      super___uniq_ptr_impl<Lib::InferenceExtra,_std::default_delete<Lib::InferenceExtra>_>
                      ._M_t.
                      super__Tuple_impl<0UL,_Lib::InferenceExtra_*,_std::default_delete<Lib::InferenceExtra>_>
                      .super__Head_base<0UL,_Lib::InferenceExtra_*,_false>._M_head_impl * 3;
  this_01 = __ptr;
  while (this_01 != pDVar6) {
    if ((this_01->_timestamp >> 2 == uVar5) && (((ulong)*(Entry **)&this_01->_timestamp & 1) == 0))
    {
      this_00 = (unique_ptr<Lib::InferenceExtra,_std::default_delete<Lib::InferenceExtra>_> *)
                &stack0xffffffffffffffb8;
      std::unique_ptr<Lib::InferenceExtra,_std::default_delete<Lib::InferenceExtra>_>::unique_ptr
                (this_00,(unique_ptr<Lib::InferenceExtra,_std::default_delete<Lib::InferenceExtra>_>
                          *)*(Entry **)&this_01->_deleted);
      insert(this_01,(Unit *)in_stack_ffffffffffffffb8._M_head_impl,in_RDI);
      std::unique_ptr<Lib::InferenceExtra,_std::default_delete<Lib::InferenceExtra>_>::~unique_ptr
                (this_00);
    }
    this_01 = (DHMap<Kernel::Unit_*,_std::unique_ptr<Lib::InferenceExtra,_std::default_delete<Lib::InferenceExtra>_>,_Lib::DefaultHash,_Lib::DefaultHash2>
               *)&this_01->_entries;
    Entry::~Entry((Entry *)0x76aa03);
  }
  if (iVar4 != 0) {
    Lib::free(__ptr);
  }
  return;
}

Assistant:

void expand()
  {
    if(_capacityIndex>=DHMAP_MAX_CAPACITY_INDEX) {
      throw Exception("Lib::DHMap::expand: MaxCapacityIndex reached.");
    }

    int newCapacity=DHMapTableCapacities[_capacityIndex+1];
    void* mem = ALLOC_KNOWN(newCapacity*sizeof(Entry),"DHMap::Entry");


    Entry* oldEntries=_entries;
    Entry* oldAfterLast=_afterLast;
    unsigned oldTimestamp=_timestamp;
    int oldCapacity=_capacity;

    _timestamp=1;
    _size=0;
    _deleted=0;
    _capacityIndex++;
    _capacity = newCapacity;
    _nextExpansionOccupancy = DHMapTableNextExpansions[_capacityIndex];

    _entries = array_new<Entry>(mem, _capacity);
    _afterLast = _entries + _capacity;

    Entry* ep=oldEntries;
    while(ep!=oldAfterLast) {
      ASS(ep);
      if(ep->_info.timestamp==oldTimestamp && !ep->_info.deleted) {
	insert(std::move(ep->_key), std::move(ep->_val));
      }
      (ep++)->~Entry();
    }
    if(oldCapacity) {
      DEALLOC_KNOWN(oldEntries,oldCapacity*sizeof(Entry),"DHMap::Entry");
    }
  }